

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_lm_eval.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint max_ptr;
  int iVar1;
  cmd_ln_t *config;
  logmath_t *lmath;
  char *pcVar2;
  ngram_model_t *model;
  char *orig;
  FILE *fh;
  lineiter_t *li;
  char **ppcVar3;
  size_t sVar4;
  long ln;
  ulong n_elem;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  float64 fVar10;
  int32 tmp_nccs;
  int32 tmp_noovs;
  double local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  double local_50;
  uint local_44;
  ngram_model_t *local_40;
  ulong local_38;
  
  config = cmd_ln_parse_r((ps_config_t *)0x0,defn,argc,argv,1);
  if (config == (cmd_ln_t *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,defn);
    return 1;
  }
  verbose = ps_config_bool(config,"verbose");
  dVar8 = ps_config_float(config,"logbase");
  lmath = logmath_init((float64)dVar8,0,0);
  if (lmath == (logmath_t *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
            ,0x12f,"Failed to initialize log math\n");
  }
  else {
    pcVar2 = ps_config_str(config,"lm");
    if ((pcVar2 != (char *)0x0) &&
       (model = ngram_model_read(config,pcVar2,NGRAM_AUTO,lmath), model != (ngram_model_t *)0x0)) {
      pcVar2 = ps_config_str(config,"probdef");
      if (pcVar2 != (char *)0x0) {
        ngram_model_read_classdef(model,pcVar2);
      }
      dVar8 = ps_config_float(config,"lw");
      dVar9 = ps_config_float(config,"wip");
      ngram_model_apply_weights(model,(float32)(float)dVar8,(float32)(float)dVar9);
      pcVar2 = ps_config_str(config,"lsn");
      orig = ps_config_str(config,"text");
      if (pcVar2 == (char *)0x0) {
        if (orig != (char *)0x0) {
          pcVar2 = __ckd_salloc__(orig,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                                  ,0xff);
          uVar6 = str2words(pcVar2,(char **)0x0,0);
          if ((int)uVar6 < 0) {
            pcVar2 = "str2words(textfoo, NULL, 0) = %d, should not happen\n";
            ln = 0x102;
            n_elem = (ulong)uVar6;
LAB_001049bc:
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                    ,ln,pcVar2,n_elem);
            goto LAB_001049c3;
          }
          if (uVar6 != 0) {
            ppcVar3 = (char **)__ckd_calloc__((ulong)uVar6,8,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                                              ,0x105);
            str2words(pcVar2,ppcVar3,uVar6);
            iVar1 = calc_entropy(model,ppcVar3,uVar6,(int32 *)&local_58,(int32 *)&local_54,
                                 (int32 *)&local_5c);
            printf("input: %s\n",orig);
            fVar10 = logmath_get_base(lmath);
            dVar8 = log((double)fVar10);
            printf("cross-entropy: %f bits\n",(dVar8 * (double)iVar1) / 0.6931471805599453);
            logmath_exp(lmath,iVar1);
            printf("perplexity: %f\n");
            printf("lm score: %d\n",(ulong)local_5c);
            printf("%d words evaluated\n",(ulong)uVar6);
            printf("%d OOVs, %d context cues removed\n",(ulong)local_54,(ulong)local_58);
            ckd_free(pcVar2);
            ckd_free(ppcVar3);
          }
        }
      }
      else {
        fh = fopen(pcVar2,"r");
        if (fh == (FILE *)0x0) {
          err_msg_system(ERR_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                         ,0xc6,"failed to open transcript file %s",pcVar2);
          goto LAB_001049c3;
        }
        fVar10 = logmath_get_base(lmath);
        local_50 = log((double)fVar10);
        li = lineiter_start((FILE *)fh);
        if (li == (lineiter_t *)0x0) {
          local_68 = 0.0;
          uVar6 = 0;
          local_60 = 0;
          uVar5 = 0;
          uVar7 = 0;
        }
        else {
          local_50 = local_50 / 0.6931471805599453;
          local_68 = 0.0;
          uVar7 = 0;
          uVar5 = 0;
          local_60 = 0;
          uVar6 = 0;
          local_40 = model;
          do {
            max_ptr = str2words(li->buf,(char **)0x0,0);
            n_elem = (ulong)max_ptr;
            if ((int)max_ptr < 0) {
              pcVar2 = "str2words(line, NULL, 0) = %d, should not happen\n";
              ln = 0xd3;
              goto LAB_001049bc;
            }
            if (max_ptr != 0) {
              local_44 = uVar6;
              local_38 = uVar5;
              ppcVar3 = (char **)__ckd_calloc__(n_elem,8,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
                                                ,0xd6);
              str2words(li->buf,ppcVar3,max_ptr);
              pcVar2 = ppcVar3[max_ptr - 1];
              uVar6 = max_ptr;
              if ((*pcVar2 == '(') &&
                 (sVar4 = strlen(pcVar2), uVar6 = max_ptr - 1, pcVar2[sVar4 - 1] != ')')) {
                uVar6 = max_ptr;
              }
              iVar1 = calc_entropy(local_40,ppcVar3,uVar6,(int32 *)&local_58,(int32 *)&local_54,
                                   (int32 *)&local_5c);
              local_68 = local_68 +
                         (double)(int)((uVar6 - local_58) - local_54) * (double)iVar1 * local_50;
              uVar7 = uVar7 + local_58;
              uVar5 = (ulong)((int)local_38 + local_54);
              local_60 = local_60 + local_5c;
              uVar6 = local_44 + uVar6;
              ckd_free(ppcVar3);
            }
            li = lineiter_next(li);
          } while (li != (lineiter_t *)0x0);
        }
        printf("cross-entropy: %f bits\n");
        exp2(local_68 / (double)(int)((uVar6 - (int)uVar5) - uVar7));
        printf("perplexity: %f\n");
        printf("lm score: %d\n",(ulong)local_60);
        printf("%d words evaluated\n",(ulong)uVar6);
        printf("%d OOVs (%.2f%%), %d context cues removed\n",
               ((double)(int)uVar5 / (double)(int)uVar6) * 100.0,uVar5,(ulong)uVar7);
      }
      return 0;
    }
    pcVar2 = ps_config_str(config,"lm");
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_lm_eval.c"
            ,0x138,"Failed to load language model from %s\n",pcVar2);
  }
LAB_001049c3:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
	cmd_ln_t *config;
	ngram_model_t *lm = NULL;
	logmath_t *lmath;
	const char *lmfn, *probdefn, *lsnfn, *text;

	if ((config = cmd_ln_parse_r(NULL, defn, argc, argv, TRUE)) == NULL) {
            /* This probably just means that we got no arguments. */
            err_set_loglevel(ERR_INFO);
            cmd_ln_log_help_r(NULL, defn);
            return 1;
        }

        verbose = ps_config_bool(config, "verbose");

	/* Create log math object. */
	if ((lmath = logmath_init
	     (ps_config_float(config, "logbase"), 0, 0)) == NULL) {
		E_FATAL("Failed to initialize log math\n");
	}

	/* Load the language model. */
	lmfn = ps_config_str(config, "lm");
	if (lmfn == NULL
	    || (lm = ngram_model_read(config, lmfn,
				      NGRAM_AUTO, lmath)) == NULL) {
		E_FATAL("Failed to load language model from %s\n",
			ps_config_str(config, "lm"));
	}
        if ((probdefn = ps_config_str(config, "probdef")) != NULL)
            ngram_model_read_classdef(lm, probdefn);
        ngram_model_apply_weights(lm,
                                  ps_config_float(config, "lw"),
                                  ps_config_float(config, "wip"));

	/* Now evaluate some text. */
	lsnfn = ps_config_str(config, "lsn");
	text = ps_config_str(config, "text");
	if (lsnfn) {
		evaluate_file(lm, lmath, lsnfn);
	}
	else if (text) {
		evaluate_string(lm, lmath, text);
	}

	return 0;
}